

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix2d.cc
# Opt level: O0

bool sptk::Matrix2D::Add(Matrix2D *first_matrix,Matrix2D *second_matrix,Matrix2D *output)

{
  Matrix2D *output_local;
  Matrix2D *second_matrix_local;
  Matrix2D *first_matrix_local;
  
  if (output != (Matrix2D *)0x0) {
    (output->data_).x_[0] = (first_matrix->data_).x_[0] + (second_matrix->data_).x_[0];
    (output->data_).x_[1] = (first_matrix->data_).x_[1] + (second_matrix->data_).x_[1];
    (output->data_).x_[2] = (first_matrix->data_).x_[2] + (second_matrix->data_).x_[2];
    (output->data_).x_[3] = (first_matrix->data_).x_[3] + (second_matrix->data_).x_[3];
  }
  return output != (Matrix2D *)0x0;
}

Assistant:

bool Matrix2D::Add(const Matrix2D& first_matrix, const Matrix2D& second_matrix,
                   Matrix2D* output) {
  if (NULL == output) {
    return false;
  }
  output->data_.elements_.x0_ =
      first_matrix.data_.elements_.x0_ + second_matrix.data_.elements_.x0_;
  output->data_.elements_.x1_ =
      first_matrix.data_.elements_.x1_ + second_matrix.data_.elements_.x1_;
  output->data_.elements_.x2_ =
      first_matrix.data_.elements_.x2_ + second_matrix.data_.elements_.x2_;
  output->data_.elements_.x3_ =
      first_matrix.data_.elements_.x3_ + second_matrix.data_.elements_.x3_;
  return true;
}